

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<void_(bool)>::Invoke(FunctionMocker<void_(bool)> *this,bool args)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  local_20;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  holder;
  ArgumentTuple tuple;
  bool args_local;
  FunctionMocker<void_(bool)> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<void>_*,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  .super__Head_base<0UL,_testing::internal::ActionResultHolder<void>_*,_false>._M_head_impl._7_1_ =
       args;
  std::tuple<bool>::tuple<bool,_true,_true>
            ((tuple<bool> *)
             ((long)&holder._M_t.
                     super___uniq_ptr_impl<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<void>_*,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
                     .super__Head_base<0UL,_testing::internal::ActionResultHolder<void>_*,_false>.
                     _M_head_impl + 6),
             (bool *)((long)&holder._M_t.
                             super___uniq_ptr_impl<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<void>_*,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
                             .
                             super__Head_base<0UL,_testing::internal::ActionResultHolder<void>_*,_false>
                             ._M_head_impl + 7));
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<void>_*,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<void>_*,_false>
                                 ._M_head_impl + 6));
  __p = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<void>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
              *)&local_20,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
            ::operator->(&local_20);
  ActionResultHolder<void>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }